

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

void __thiscall
OpenMD::SelectionSet::flip(SelectionSet *this,vector<int,_std::allocator<int>_> *bitIndex)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  pointer pOVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  pOVar4 = (this->bitsets_).
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (bitIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar5 = 0;
  do {
    iVar1 = piVar2[lVar5];
    uVar6 = (ulong)iVar1;
    iVar7 = iVar1 + 0x3f;
    if (-1 < (long)uVar6) {
      iVar7 = iVar1;
    }
    lVar8 = (long)(iVar7 >> 6) * 8 +
            *(long *)&(pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>;
    uVar9 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
    uVar3 = *(ulong *)(lVar8 + -8 + uVar9 * 8);
    uVar10 = uVar3 | 1L << (uVar6 & 0x3f);
    if ((uVar3 >> (uVar6 & 0x3f) & 1) != 0) {
      uVar10 = uVar3 & ~(1L << (uVar6 & 0x3f));
    }
    *(ulong *)(lVar8 + -8 + uVar9 * 8) = uVar10;
    lVar5 = lVar5 + 1;
    pOVar4 = pOVar4 + 1;
  } while (lVar5 != 6);
  return;
}

Assistant:

void SelectionSet::flip(std::vector<int> bitIndex) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].flip(bitIndex[i]);
  }